

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cinatra.cpp
# Opt level: O2

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* get_header_values(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *__return_storage_ptr__,
                   span<cinatra::http_header,_18446744073709551615UL> *resp_headers,string_view key)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  long lVar2;
  value_type *__x_00;
  http_header *p;
  pointer phVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  phVar3 = resp_headers->_M_ptr;
  __x_00 = &phVar3->value;
  for (lVar2 = (resp_headers->_M_extent)._M_extent_value << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
    __x._M_len = (phVar3->name)._M_len;
    __x._M_str = (phVar3->name)._M_str;
    bVar1 = std::operator==(__x,key);
    if (bVar1) {
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(__return_storage_ptr__,__x_00);
    }
    phVar3 = phVar3 + 1;
    __x_00 = __x_00 + 2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string_view> get_header_values(
    std::span<http_header> &resp_headers, std::string_view key) {
  std::vector<std::string_view> values{};
  for (const auto &p : resp_headers) {
    if (p.name == key)
      values.push_back(p.value);
  }
  return values;
}